

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

string * __thiscall
GraphPropagator::available_to_dot_abi_cxx11_
          (string *__return_storage_ptr__,GraphPropagator *this,int *arr)

{
  BoolView *pBVar1;
  GraphPropagator *pGVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long *plVar6;
  undefined8 *puVar7;
  ulong uVar8;
  ulong *puVar9;
  long *plVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  string __str;
  string __str_2;
  string __str_1;
  long *local_f8;
  long local_e8;
  long lStack_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  string *local_90;
  GraphPropagator *local_88;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  int *local_60;
  long local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_98 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_98;
  local_60 = arr;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"graph {\n","");
  local_90 = __return_storage_ptr__;
  local_88 = this;
  if (0 < (int)(this->vs).sz) {
    uVar12 = 0;
    do {
      pBVar1 = (this->vs).data;
      if ((sat.assigns.data[(uint)pBVar1[uVar12].v] != '\0') &&
         ((uint)pBVar1[uVar12].s * -2 + 1 == (int)sat.assigns.data[(uint)pBVar1[uVar12].v])) {
        uVar14 = 1;
        if (9 < uVar12) {
          uVar3 = 4;
          uVar8 = uVar12;
          do {
            uVar14 = uVar3;
            uVar11 = (uint)uVar8;
            if (uVar11 < 100) {
              uVar14 = uVar14 - 2;
              goto LAB_001cd397;
            }
            if (uVar11 < 1000) {
              uVar14 = uVar14 - 1;
              goto LAB_001cd397;
            }
            if (uVar11 < 10000) goto LAB_001cd397;
            uVar8 = (uVar8 & 0xffffffff) / 10000;
            uVar3 = uVar14 + 4;
          } while (99999 < uVar11);
          uVar14 = uVar14 + 1;
        }
LAB_001cd397:
        local_b8 = &local_a8;
        std::__cxx11::string::_M_construct((ulong)&local_b8,(char)uVar14);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b8,uVar14,(uint)uVar12);
        plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x1dbae4);
        this = local_88;
        local_d8 = &local_c8;
        puVar9 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar9) {
          local_c8 = *puVar9;
          lStack_c0 = plVar6[3];
        }
        else {
          local_c8 = *puVar9;
          local_d8 = (ulong *)*plVar6;
        }
        local_d0 = plVar6[1];
        *plVar6 = (long)puVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_d8);
        local_f8 = &local_e8;
        plVar10 = plVar6 + 2;
        if ((long *)*plVar6 == plVar10) {
          local_e8 = *plVar10;
          lStack_e0 = plVar6[3];
        }
        else {
          local_e8 = *plVar10;
          local_f8 = (long *)*plVar6;
        }
        *plVar6 = (long)plVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8);
        if (local_f8 != &local_e8) {
          operator_delete(local_f8);
        }
        if (local_d8 != &local_c8) {
          operator_delete(local_d8);
        }
        if (local_b8 != &local_a8) {
          operator_delete(local_b8);
        }
      }
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)(int)(this->vs).sz);
  }
  if (0 < (int)(this->es).sz) {
    lVar13 = 0;
    do {
      pBVar1 = (this->es).data;
      if ((sat.assigns.data[(uint)pBVar1[lVar13].v] == '\0') ||
         ((uint)pBVar1[lVar13].s * -2 + 1 == (int)sat.assigns.data[(uint)pBVar1[lVar13].v])) {
        local_58 = lVar13 * 3;
        uVar14 = **(uint **)&(this->endnodes).
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar13].
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data;
        uVar3 = -uVar14;
        if (0 < (int)uVar14) {
          uVar3 = uVar14;
        }
        uVar11 = 1;
        if (9 < uVar3) {
          uVar12 = (ulong)uVar3;
          uVar4 = 4;
          do {
            uVar11 = uVar4;
            uVar5 = (uint)uVar12;
            if (uVar5 < 100) {
              uVar11 = uVar11 - 2;
              goto LAB_001cd596;
            }
            if (uVar5 < 1000) {
              uVar11 = uVar11 - 1;
              goto LAB_001cd596;
            }
            if (uVar5 < 10000) goto LAB_001cd596;
            uVar12 = uVar12 / 10000;
            uVar4 = uVar11 + 4;
          } while (99999 < uVar5);
          uVar11 = uVar11 + 1;
        }
LAB_001cd596:
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct
                  ((ulong)local_50,(char)uVar11 - (char)((int)uVar14 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0] + (uVar14 >> 0x1f),uVar11,uVar3)
        ;
        plVar6 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1dbae4);
        local_b8 = &local_a8;
        plVar10 = plVar6 + 2;
        if ((long *)*plVar6 == plVar10) {
          local_a8 = *plVar10;
          lStack_a0 = plVar6[3];
        }
        else {
          local_a8 = *plVar10;
          local_b8 = (long *)*plVar6;
        }
        local_b0 = plVar6[1];
        *plVar6 = (long)plVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_b8);
        __return_storage_ptr__ = local_90;
        puVar9 = (ulong *)(plVar6 + 2);
        if ((ulong *)*plVar6 == puVar9) {
          local_c8 = *puVar9;
          lStack_c0 = plVar6[3];
          local_d8 = &local_c8;
        }
        else {
          local_c8 = *puVar9;
          local_d8 = (ulong *)*plVar6;
        }
        local_d0 = plVar6[1];
        *plVar6 = (long)puVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        uVar14 = *(uint *)(*(long *)((long)&(((local_88->endnodes).
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                            super__Vector_impl_data + local_58 * 8) + 4);
        uVar3 = -uVar14;
        if (0 < (int)uVar14) {
          uVar3 = uVar14;
        }
        uVar11 = 1;
        if (9 < uVar3) {
          uVar12 = (ulong)uVar3;
          uVar4 = 4;
          do {
            uVar11 = uVar4;
            uVar5 = (uint)uVar12;
            if (uVar5 < 100) {
              uVar11 = uVar11 - 2;
              goto LAB_001cd707;
            }
            if (uVar5 < 1000) {
              uVar11 = uVar11 - 1;
              goto LAB_001cd707;
            }
            if (uVar5 < 10000) goto LAB_001cd707;
            uVar12 = uVar12 / 10000;
            uVar4 = uVar11 + 4;
          } while (99999 < uVar5);
          uVar11 = uVar11 + 1;
        }
LAB_001cd707:
        local_80 = local_70;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_80,(char)uVar11 - (char)((int)uVar14 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)(uVar14 >> 0x1f) + (long)local_80),uVar11,uVar3);
        uVar12 = 0xf;
        if (local_d8 != &local_c8) {
          uVar12 = local_c8;
        }
        if (uVar12 < (ulong)(local_78 + local_d0)) {
          uVar12 = 0xf;
          if (local_80 != local_70) {
            uVar12 = local_70[0];
          }
          if (uVar12 < (ulong)(local_78 + local_d0)) goto LAB_001cd792;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_d8);
        }
        else {
LAB_001cd792:
          puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_80);
        }
        plVar6 = puVar7 + 2;
        if ((long *)*puVar7 == plVar6) {
          local_e8 = *plVar6;
          lStack_e0 = puVar7[3];
          local_f8 = &local_e8;
        }
        else {
          local_e8 = *plVar6;
          local_f8 = (long *)*puVar7;
        }
        *puVar7 = plVar6;
        puVar7[1] = 0;
        *(undefined1 *)plVar6 = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8);
        if (local_f8 != &local_e8) {
          operator_delete(local_f8);
        }
        if (local_80 != local_70) {
          operator_delete(local_80);
        }
        if (local_d8 != &local_c8) {
          operator_delete(local_d8);
        }
        pGVar2 = local_88;
        if (local_b8 != &local_a8) {
          operator_delete(local_b8);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        pBVar1 = (pGVar2->es).data;
        if ((sat.assigns.data[(uint)pBVar1[lVar13].v] != '\0') &&
           ((uint)pBVar1[lVar13].s * -2 + 1 == (int)sat.assigns.data[(uint)pBVar1[lVar13].v])) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        uVar14 = local_60[lVar13];
        uVar3 = -uVar14;
        if (0 < (int)uVar14) {
          uVar3 = uVar14;
        }
        uVar11 = 1;
        local_b8 = &local_a8;
        if (9 < uVar3) {
          uVar12 = (ulong)uVar3;
          uVar4 = 4;
          do {
            uVar11 = uVar4;
            uVar5 = (uint)uVar12;
            if (uVar5 < 100) {
              uVar11 = uVar11 - 2;
              goto LAB_001cd915;
            }
            if (uVar5 < 1000) {
              uVar11 = uVar11 - 1;
              goto LAB_001cd915;
            }
            if (uVar5 < 10000) goto LAB_001cd915;
            uVar12 = uVar12 / 10000;
            uVar4 = uVar11 + 4;
          } while (99999 < uVar5);
          uVar11 = uVar11 + 1;
        }
LAB_001cd915:
        std::__cxx11::string::_M_construct
                  ((ulong)&local_b8,(char)uVar11 - (char)((int)uVar14 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((long)local_b8 + (ulong)(uVar14 >> 0x1f)),uVar11,uVar3);
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x1dff8f);
        puVar9 = puVar7 + 2;
        if ((ulong *)*puVar7 == puVar9) {
          local_c8 = *puVar9;
          lStack_c0 = puVar7[3];
          local_d8 = &local_c8;
        }
        else {
          local_c8 = *puVar9;
          local_d8 = (ulong *)*puVar7;
        }
        local_d0 = puVar7[1];
        *puVar7 = puVar9;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
        plVar6 = puVar7 + 2;
        if ((long *)*puVar7 == plVar6) {
          local_e8 = *plVar6;
          lStack_e0 = puVar7[3];
          local_f8 = &local_e8;
        }
        else {
          local_e8 = *plVar6;
          local_f8 = (long *)*puVar7;
        }
        *puVar7 = plVar6;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8);
        if (local_f8 != &local_e8) {
          operator_delete(local_f8);
        }
        if (local_d8 != &local_c8) {
          operator_delete(local_d8);
        }
        this = local_88;
        if (local_b8 != &local_a8) {
          operator_delete(local_b8);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < (int)(this->es).sz);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string GraphPropagator::available_to_dot(int* arr) {
	std::string res = "graph {\n";
	for (int n = 0; n < nbNodes(); n++) {
		if (getNodeVar(n).isFixed() && getNodeVar(n).isTrue()) {
			res += " " + std::to_string(n) + " [color = red];\n";
		}
	}
	for (int e = 0; e < nbEdges(); e++) {
		if (!getEdgeVar(e).isFixed() || getEdgeVar(e).isTrue()) {
			res += " " + std::to_string(getTail(e)) + " -- " + std::to_string(getHead(e));
			if (getEdgeVar(e).isFixed() && getEdgeVar(e).isTrue()) {
				res += " [color = red] ";
			}
			res += "[label = \"" + std::to_string(arr[e]) + "\"]";
			res += ";\n";
		}
	}
	res += "}";

	return res;
}